

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O2

int mapEndSurfaceHeight(float *y,EndNoise *en,SurfaceNoise *sn,int x,int z,int w,int h,int scale,
                       int ymin)

{
  ulong uVar1;
  double *pdVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  double *__ptr;
  ulong uVar7;
  uint uVar8;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int colymin;
  int iVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  double *pdVar19;
  double *column;
  double *pdVar20;
  int iVar21;
  bool bVar22;
  double *local_a0;
  double local_98;
  float *local_68;
  ulong uVar9;
  ulong uVar18;
  
  iVar4 = 1;
  if (((uint)scale < 9) && ((0x116U >> (scale & 0x1fU) & 1) != 0)) {
    iVar4 = 2;
    if (2 < ymin >> 2) {
      iVar4 = ymin >> 2;
    }
    colymin = 0x11;
    if (iVar4 < 0x11) {
      colymin = iVar4;
    }
    bVar3 = 8 / (byte)scale;
    uVar14 = (uint)bVar3;
    uVar8 = 0x13 - colymin;
    uVar9 = (ulong)uVar8;
    iVar10 = x / (int)uVar14 - (uint)(x % (int)uVar14 != 0 && x < 0);
    iVar4 = w + x + -1;
    uVar15 = (uint)bVar3;
    local_98 = (double)scale * 0.0625;
    uVar5 = ((iVar4 / (int)uVar15 - iVar10) - (uint)(iVar4 % (int)uVar15 != 0 && w + x < 1)) + 2;
    __ptr = (double *)malloc(uVar9 * (long)(int)uVar5 * 0x10);
    local_a0 = __ptr + (int)(uVar8 * uVar5);
    uVar17 = 0;
    pdVar19 = local_a0;
    iVar4 = iVar10;
    uVar18 = uVar17;
    if (0 < (int)uVar5) {
      uVar17 = (ulong)uVar5;
      uVar18 = uVar17;
    }
    while (bVar22 = uVar17 != 0, uVar17 = uVar17 - 1, bVar22) {
      sampleNoiseColumnEnd
                (pdVar19,sn,en,iVar4,z / (int)uVar14 - (uint)(z % (int)uVar14 != 0 && z < 0),colymin
                 ,0x12);
      pdVar19 = pdVar19 + uVar9;
      iVar4 = iVar4 + 1;
    }
    if ((uint)scale < 2) {
      local_98 = 0.0;
    }
    uVar12 = 0;
    uVar17 = 0;
    if (0 < w) {
      uVar17 = (ulong)(uint)w;
    }
    uVar7 = (ulong)(uint)h;
    if (h < 1) {
      uVar7 = uVar12;
    }
    pdVar19 = __ptr;
    local_68 = y;
    for (; uVar12 != uVar7; uVar12 = uVar12 + 1) {
      uVar11 = uVar12 + (long)z;
      iVar13 = (int)uVar11;
      uVar1 = (ulong)(uint)(iVar13 >> 0x1f) << 0x20 | uVar11 & 0xffffffff;
      iVar21 = (int)((long)uVar1 / (long)(int)uVar15) -
               (uint)((int)((long)uVar1 % (long)(int)uVar15) != 0 && (long)uVar11 < 0);
      iVar4 = iVar21 * uVar15;
      if ((uVar12 == 0) || (pdVar20 = pdVar19, pdVar2 = local_a0, iVar13 == iVar4)) {
        uVar11 = uVar18;
        column = pdVar19;
        iVar16 = iVar10;
        while (bVar22 = uVar11 != 0, uVar11 = uVar11 - 1, pdVar20 = local_a0, pdVar2 = pdVar19,
              bVar22) {
          sampleNoiseColumnEnd(column,sn,en,iVar16,iVar21 + 1,colymin,0x12);
          iVar16 = iVar16 + 1;
          column = column + uVar9;
        }
      }
      local_a0 = pdVar2;
      iVar21 = x;
      for (uVar11 = 0; uVar17 != uVar11; uVar11 = uVar11 + 1) {
        iVar16 = iVar21 / (int)uVar15 -
                 (uint)(iVar21 % (int)uVar15 != 0 && (long)((long)x + uVar11) < 0);
        iVar6 = (iVar16 - iVar10) * uVar8;
        iVar16 = getSurfaceHeight(pdVar20 + iVar6,local_a0 + iVar6,pdVar20 + iVar6 + uVar9,
                                  local_a0 + iVar6 + uVar9,colymin,0x12,4,
                                  (double)(int)(((int)uVar11 + x) - iVar16 * (uint)bVar3) /
                                  (double)(int)(char)bVar3 + local_98,
                                  (double)(iVar13 - iVar4) / (double)(int)(char)bVar3 + local_98);
        local_68[uVar11] = (float)iVar16;
        iVar21 = iVar21 + 1;
      }
      local_68 = local_68 + w;
      pdVar19 = pdVar20;
    }
    free(__ptr);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int mapEndSurfaceHeight(float *y, const EndNoise *en, const SurfaceNoise *sn,
    int x, int z, int w, int h, int scale, int ymin)
{
    if (scale != 1 && scale != 2 && scale != 4 && scale != 8)
        return 1;

    int y0 = ymin >> 2;
    if (y0 <  2) y0 =  2;
    if (y0 > 17) y0 = 17;
    int y1 = 18;
    int yn = y1 - y0 + 1;
    double cellmid = scale > 1 ? scale / 16.0 : 0;
    int cellsiz = 8 / scale;
    int cx = floordiv(x, cellsiz);
    int cz = floordiv(z, cellsiz);
    int cw = floordiv(x + w - 1, cellsiz) - cx + 2;
    int i, j;

    double *buf = malloc(sizeof(double) * yn * cw * 2);
    double *ncol[2];
    ncol[0] = buf;
    ncol[1] = buf + yn * cw;

    for (i = 0; i < cw; i++)
        sampleNoiseColumnEnd(ncol[1]+i*yn, sn, en, cx+i, cz+0, y0, y1);

    for (j = 0; j < h; j++)
    {
        int cj = floordiv(z + j, cellsiz);
        int dj = z + j - cj * cellsiz;
        if (j == 0 || dj == 0)
        {
            double *tmp = ncol[0];
            ncol[0] = ncol[1];
            ncol[1] = tmp;
            for (i = 0; i < cw; i++)
                sampleNoiseColumnEnd(ncol[1]+i*yn, sn, en, cx+i, cj+1, y0, y1);
        }

        for (i = 0; i < w; i++)
        {
            int ci = floordiv(x + i, cellsiz);
            int di = x + i - ci * cellsiz;
            double dx = di / (double) cellsiz + cellmid;
            double dz = dj / (double) cellsiz + cellmid;
            double *ncol0 = ncol[0] + (ci - cx) * yn;
            double *ncol1 = ncol[1] + (ci - cx) * yn;
            y[j*w+i] = getSurfaceHeight(ncol0, ncol1, ncol0+yn, ncol1+yn,
                y0, y1, 4, dx, dz);
        }
    }

    free(buf);
    return 0;
}